

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler *pResampler,ma_int16 *pFrameOut)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar1 = (pResampler->config).channels;
  uVar2 = (pResampler->inTimeFrac << 0xc) / (pResampler->config).sampleRateOut;
  for (uVar3 = 0; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    pFrameOut[uVar3] =
         (ma_int16)
         ((int)*(short *)((long)(pResampler->x1).f32 + uVar3 * 2) * uVar2 +
          (int)*(short *)((long)(pResampler->x0).f32 + uVar3 * 2) * (0x1000 - uVar2) >> 0xc);
  }
  return;
}

Assistant:

static void ma_linear_resampler_interpolate_frame_s16(ma_linear_resampler* pResampler, ma_int16* MA_RESTRICT pFrameOut)
{
    ma_uint32 c;
    ma_uint32 a;
    const ma_uint32 channels = pResampler->config.channels;
    const ma_uint32 shift = 12;

    MA_ASSERT(pResampler != NULL);
    MA_ASSERT(pFrameOut  != NULL);

    a = (pResampler->inTimeFrac << shift) / pResampler->config.sampleRateOut;

    MA_ASSUME(channels > 0);
    for (c = 0; c < channels; c += 1) {
        ma_int16 s = ma_linear_resampler_mix_s16(pResampler->x0.s16[c], pResampler->x1.s16[c], a, shift);
        pFrameOut[c] = s;
    }
}